

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_posix.c
# Opt level: O0

tree * tree_open(char *path,wchar_t symlink_mode,wchar_t restore_time)

{
  tree *t_00;
  tree *t;
  wchar_t restore_time_local;
  wchar_t symlink_mode_local;
  char *path_local;
  
  t_00 = (tree *)malloc(0x240);
  if (t_00 == (tree *)0x0) {
    path_local = (char *)0x0;
  }
  else {
    memset(t_00,0,0x240);
    (t_00->path).s = (char *)0x0;
    (t_00->path).length = 0;
    (t_00->path).buffer_length = 0;
    archive_string_ensure(&t_00->path,0x1f);
    t_00->initial_symlink_mode = (char)symlink_mode;
    path_local = (char *)tree_reopen(t_00,path,restore_time);
  }
  return (tree *)path_local;
}

Assistant:

static struct tree *
tree_open(const char *path, int symlink_mode, int restore_time)
{
	struct tree *t;

	if ((t = malloc(sizeof(*t))) == NULL)
		return (NULL);
	memset(t, 0, sizeof(*t));
	archive_string_init(&t->path);
	archive_string_ensure(&t->path, 31);
	t->initial_symlink_mode = symlink_mode;
	return (tree_reopen(t, path, restore_time));
}